

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_finish(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  undefined8 *puVar2;
  tag_t<cfgfile::string_trait_t> *this_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  exception_t<cfgfile::string_trait_t> *peVar5;
  undefined8 *puVar6;
  allocator local_2d5;
  allocator local_2d4;
  allocator local_2d3;
  allocator local_2d2;
  allocator local_2d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->super_tag_t<cfgfile::string_trait_t>).m_is_defined == false) {
    peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1f0,"Undefined value of tag: \"",(allocator *)local_b0);
    std::__cxx11::string::string((string *)&local_1d0,(string *)&local_1f0);
    std::operator+(&local_1b0,&local_1d0,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    std::__cxx11::string::string(local_230,"\". In file \"",(allocator *)&local_d0);
    std::__cxx11::string::string((string *)&local_210,local_230);
    std::operator+(&local_190,&local_1b0,&local_210);
    std::operator+(&local_170,&local_190,&info->m_file_name);
    std::__cxx11::string::string(local_270,"\" on line ",(allocator *)&local_f0);
    std::__cxx11::string::string((string *)&local_250,local_270);
    std::operator+(&local_150,&local_170,&local_250);
    std::__cxx11::to_string(&local_290,info->m_line_number);
    std::operator+(&local_130,&local_150,&local_290);
    std::__cxx11::string::string((string *)&local_2d0,".",(allocator *)local_110);
    std::__cxx11::string::string((string *)&local_2b0,(string *)&local_2d0);
    std::operator+(&local_50,&local_130,&local_2b0);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_50);
    __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  pcVar1 = this->m_constraint;
  if (pcVar1 != (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    iVar4 = (*pcVar1->_vptr_constraint_t[2])(pcVar1,&this->m_value);
    if ((char)iVar4 == '\0') {
      peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_230,"Invalid value: \"",&local_2d1);
      std::__cxx11::string::string((string *)&local_210,local_230);
      std::operator+(&local_1f0,&local_210,&this->m_value);
      std::__cxx11::string::string
                (local_270,"\". Value must match to the constraint in tag \"",&local_2d2);
      std::__cxx11::string::string((string *)&local_250,local_270);
      std::operator+(&local_1d0,&local_1f0,&local_250);
      std::operator+(&local_1b0,&local_1d0,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
      std::__cxx11::string::string((string *)&local_2b0,"\". In file \"",&local_2d3);
      std::__cxx11::string::string((string *)&local_290,(string *)&local_2b0);
      std::operator+(&local_190,&local_1b0,&local_290);
      std::operator+(&local_170,&local_190,&info->m_file_name);
      std::__cxx11::string::string(local_b0,"\" on line ",&local_2d4);
      std::__cxx11::string::string((string *)&local_2d0,local_b0);
      std::operator+(&local_150,&local_170,&local_2d0);
      std::__cxx11::to_string(&local_d0,info->m_line_number);
      std::operator+(&local_130,&local_150,&local_d0);
      std::__cxx11::string::string(local_110,".",&local_2d5);
      std::__cxx11::string::string((string *)&local_f0,local_110);
      std::operator+(&local_70,&local_130,&local_f0);
      exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_70);
      __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  iVar4 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
  puVar6 = *(undefined8 **)CONCAT44(extraout_var,iVar4);
  puVar2 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar4))[1];
  do {
    if (puVar6 == puVar2) {
      return;
    }
    this_00 = (tag_t<cfgfile::string_trait_t> *)*puVar6;
    if (this_00->m_is_mandatory == true) {
      bVar3 = tag_t<cfgfile::string_trait_t>::is_defined(this_00);
      if (!bVar3) {
        peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_230,"Undefined child mandatory tag: \"",&local_2d1);
        std::__cxx11::string::string((string *)&local_210,local_230);
        std::operator+(&local_1f0,&local_210,&this_00->m_name);
        std::__cxx11::string::string(local_270,"\". Where parent is: \"",&local_2d2);
        std::__cxx11::string::string((string *)&local_250,local_270);
        std::operator+(&local_1d0,&local_1f0,&local_250);
        std::operator+(&local_1b0,&local_1d0,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
        std::__cxx11::string::string((string *)&local_2b0,"\". In file \"",&local_2d3);
        std::__cxx11::string::string((string *)&local_290,(string *)&local_2b0);
        std::operator+(&local_190,&local_1b0,&local_290);
        std::operator+(&local_170,&local_190,&info->m_file_name);
        std::__cxx11::string::string(local_b0,"\" on line ",&local_2d4);
        std::__cxx11::string::string((string *)&local_2d0,local_b0);
        std::operator+(&local_150,&local_170,&local_2d0);
        std::__cxx11::to_string(&local_d0,info->m_line_number);
        std::operator+(&local_130,&local_150,&local_d0);
        std::__cxx11::string::string(local_110,".",&local_2d5);
        std::__cxx11::string::string((string *)&local_f0,local_110);
        std::operator+(&local_90,&local_130,&local_f0);
        exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_90);
        __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                    exception_t<cfgfile::string_trait_t>::~exception_t);
      }
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		if( m_constraint )
		{
			if( !m_constraint->check( m_value ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					m_value +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() +
					Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}